

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

void charactersDebug(void *ctx,xmlChar *ch,int len)

{
  int local_5c;
  xmlChar local_58 [4];
  int i;
  char out [40];
  xmllintState *lint;
  int len_local;
  xmlChar *ch_local;
  void *ctx_local;
  
  *(int *)((long)ctx + 0x28) = *(int *)((long)ctx + 0x28) + 1;
  if (*(int *)((long)ctx + 0x3c) == 0) {
    for (local_5c = 0; local_5c < len && local_5c < 0x1e; local_5c = local_5c + 1) {
      local_58[local_5c] = ch[local_5c];
    }
    local_58[local_5c] = '\0';
    fprintf(_stdout,"SAX.characters(%s, %d)\n",local_58,(ulong)(uint)len);
  }
  return;
}

Assistant:

static void
charactersDebug(void *ctx, const xmlChar *ch, int len)
{
    xmllintState *lint = ctx;
    char out[40];
    int i;

    lint->callbacks++;
    if (lint->noout)
	return;
    for (i = 0;(i<len) && (i < 30);i++)
	out[i] = (char) ch[i];
    out[i] = 0;

    fprintf(stdout, "SAX.characters(%s, %d)\n", out, len);
}